

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::count_digits<3u>
          (int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>> *this)

{
  uint local_1c;
  ulong uStack_18;
  uint num_digits;
  unsigned_type n;
  int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_> *this_local;
  
  uStack_18 = *(ulong *)(this + 0x10);
  local_1c = 0;
  do {
    local_1c = local_1c + 1;
    uStack_18 = uStack_18 >> 3;
  } while (uStack_18 != 0);
  return local_1c;
}

Assistant:

unsigned count_digits() const {
      unsigned_type n = abs_value;
      unsigned num_digits = 0;
      do {
        ++num_digits;
      } while ((n >>= BITS) != 0);
      return num_digits;
    }